

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O2

void duckdb::
     TemplatedWritePlain<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType,duckdb::ParquetUUIDOperator,true>
               (Vector *col,ColumnWriterStatistics *stats,idx_t chunk_start,idx_t chunk_end,
               ValidityMask *mask,WriteStream *ser)

{
  long lVar1;
  idx_t extraout_RDX;
  uint64_t *puVar2;
  idx_t r;
  idx_t iVar3;
  ParquetUUIDTargetType target_value_00;
  hugeint_t input;
  ParquetUUIDTargetType target_value;
  
  lVar1 = chunk_start * 0x10;
  puVar2 = (uint64_t *)(col->data + lVar1 + 8);
  for (iVar3 = chunk_start; iVar3 < chunk_end; iVar3 = iVar3 + 1) {
    input.upper = chunk_start;
    input.lower = *puVar2;
    target_value = ParquetUUIDOperator::Operation<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
                             ((ParquetUUIDOperator *)puVar2[-1],input);
    target_value_00.bytes._0_8_ = target_value.bytes._8_8_;
    target_value_00.bytes[8] = (char)lVar1;
    target_value_00.bytes[9] = (char)((ulong)lVar1 >> 8);
    target_value_00.bytes[10] = (char)((ulong)lVar1 >> 0x10);
    target_value_00.bytes[0xb] = (char)((ulong)lVar1 >> 0x18);
    target_value_00.bytes[0xc] = (char)((ulong)lVar1 >> 0x20);
    target_value_00.bytes[0xd] = (char)((ulong)lVar1 >> 0x28);
    target_value_00.bytes[0xe] = (char)((ulong)lVar1 >> 0x30);
    target_value_00.bytes[0xf] = (char)((ulong)lVar1 >> 0x38);
    ParquetUUIDOperator::HandleStats<duckdb::hugeint_t,duckdb::ParquetUUIDTargetType>
              ((ParquetUUIDOperator *)stats,target_value.bytes._0_8_,target_value_00);
    (*(code *)*(mask->super_TemplatedValidityMask<unsigned_long>).validity_mask)
              (mask,&target_value,0x10);
    puVar2 = puVar2 + 2;
    chunk_start = extraout_RDX;
  }
  return;
}

Assistant:

static void TemplatedWritePlain(Vector &col, ColumnWriterStatistics *stats, const idx_t chunk_start,
                                const idx_t chunk_end, const ValidityMask &mask, WriteStream &ser) {
	static constexpr bool COPY_DIRECTLY_FROM_VECTOR =
	    ALL_VALID && std::is_same<SRC, TGT>::value && std::is_arithmetic<TGT>::value;

	const auto *const ptr = FlatVector::GetData<SRC>(col);

	TGT local_write[STANDARD_VECTOR_SIZE];
	idx_t local_write_count = 0;

	for (idx_t r = chunk_start; r < chunk_end; r++) {
		if (!ALL_VALID && !mask.RowIsValid(r)) {
			continue;
		}

		TGT target_value = OP::template Operation<SRC, TGT>(ptr[r]);
		OP::template HandleStats<SRC, TGT>(stats, target_value);

		if (COPY_DIRECTLY_FROM_VECTOR) {
			continue;
		}

		if (std::is_arithmetic<TGT>::value) {
			local_write[local_write_count++] = target_value;
			if (local_write_count == STANDARD_VECTOR_SIZE) {
				ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
				local_write_count = 0;
			}
		} else {
			OP::template WriteToStream<SRC, TGT>(target_value, ser);
		}
	}

	if (COPY_DIRECTLY_FROM_VECTOR) {
		ser.WriteData(const_data_ptr_cast(&ptr[chunk_start]), (chunk_end - chunk_start) * sizeof(TGT));
		return;
	}

	if (std::is_arithmetic<TGT>::value) {
		ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
	}
	// Else we already wrote to stream
}